

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# passkey.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  ggml_backend_dev_t *ppgVar1;
  string *text;
  ulong uVar2;
  undefined8 uVar3;
  llama_token *plVar4;
  llama_token *plVar5;
  bool bVar6;
  undefined1 uVar7;
  byte bVar8;
  int iVar9;
  uint uVar10;
  llama_token lVar11;
  long *plVar12;
  undefined8 *puVar13;
  llama_context *plVar14;
  undefined8 uVar15;
  common_log *pcVar16;
  float ***pppfVar17;
  size_type *psVar18;
  long *plVar19;
  long lVar20;
  long lVar21;
  uint __uval;
  uint uVar22;
  int iVar23;
  float **ppfVar24;
  int *piVar25;
  int iVar26;
  uint uVar27;
  ulong uVar28;
  ulong uVar29;
  float fVar30;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  llama_batch batch;
  string __str_1;
  string __str;
  string prompt_suffix;
  string prompt_prefix;
  llama_model_params model_params;
  llama_context_params ctx_params;
  common_params params;
  int local_1638 [2];
  int iStack_1630;
  undefined4 uStack_162c;
  undefined4 local_1628;
  undefined4 uStack_1624;
  int iStack_1620;
  undefined4 uStack_161c;
  int local_1618;
  undefined4 uStack_1614;
  undefined4 uStack_1610;
  undefined4 uStack_160c;
  int8_t *local_1608;
  uint local_15b8;
  int local_15b4;
  llama_context *local_15b0;
  ulong local_15a8;
  undefined4 local_15a0;
  int local_159c;
  ulong local_1598;
  int local_158c;
  float ***local_1588;
  ulong local_1580;
  string local_1578;
  ulong local_1558;
  uint local_154c;
  llama_batch local_1548;
  ulong local_1508;
  float ***local_1500;
  ulong local_14f8;
  ulong local_14f0;
  uint local_14e8;
  uint local_14e4;
  float ***local_14e0;
  long local_14d8;
  float **local_14d0 [2];
  float **local_14c0;
  undefined8 local_14b8;
  long *local_14b0 [2];
  long local_14a0 [2];
  float ***local_1490;
  long *local_1488 [2];
  long local_1478 [2];
  string local_1468;
  long local_1448;
  undefined8 local_1440;
  undefined1 local_1438 [16];
  ggml_backend_dev_t local_1428 [7];
  llama_context_params local_13f0;
  common_params local_1378;
  
  bVar8 = 0;
  common_params::common_params(&local_1378);
  local_1378.n_junk = 0xfa;
  local_1378.i_pos = -1;
  local_1378.n_keep = 0x20;
  bVar6 = common_params_parse(argc,argv,&local_1378,LLAMA_EXAMPLE_PASSKEY,print_usage);
  iVar9 = 1;
  if (bVar6) {
    common_init();
    local_159c = local_1378.n_junk;
    local_14f8 = (ulong)(uint)local_1378.n_keep;
    local_1580 = (ulong)(uint)local_1378.grp_attn_n;
    local_158c = local_1378.i_pos;
    if (local_1378.i_pos == -1) {
      local_158c = rand();
      local_158c = local_158c % local_159c;
    }
    local_1468._M_dataplus._M_p = (pointer)&local_1468.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1468,
               "There is an important info hidden inside a lot of irrelevant text. Find it and memorize them. I will quiz you about the important information there."
               ,"");
    local_1488[0] = local_1478;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1488," What is the pass key? The pass key is","");
    text = &local_1378.prompt;
    std::__cxx11::string::_M_assign((string *)text);
    iVar9 = rand();
    local_14e8 = iVar9 % 50000 + 1;
    if (0 < local_159c) {
      uVar27 = -local_14e8;
      if (0 < (int)local_14e8) {
        uVar27 = local_14e8;
      }
      uVar28 = (ulong)(local_14e8 >> 0x1f);
      local_15a8 = CONCAT44(local_15a8._4_4_,5 - (uint)(uVar27 < 10000));
      iVar9 = 0;
      local_1598 = uVar28;
      do {
        if (local_158c == iVar9) {
          uVar10 = 2 - (uVar27 < 10);
          uVar22 = (uint)local_15a8;
          if (uVar27 < 1000) {
            uVar22 = 3;
          }
          if (uVar27 < 100) {
            uVar22 = uVar10;
          }
          if (uVar27 < 10) {
            uVar22 = uVar10;
          }
          local_14b0[0] = local_14a0;
          std::__cxx11::string::_M_construct((ulong)local_14b0,(char)uVar22 + (char)uVar28);
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)((long)local_14b0[0] + uVar28),uVar22,uVar27);
          plVar12 = (long *)std::__cxx11::string::replace((ulong)local_14b0,0,(char *)0x0,0x21319c);
          local_1578._M_dataplus._M_p = (pointer)&local_1578.field_2;
          psVar18 = (size_type *)(plVar12 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar18) {
            local_1578.field_2._M_allocated_capacity = *psVar18;
            local_1578.field_2._8_8_ = plVar12[3];
          }
          else {
            local_1578.field_2._M_allocated_capacity = *psVar18;
            local_1578._M_dataplus._M_p = (pointer)*plVar12;
          }
          local_1578._M_string_length = plVar12[1];
          *plVar12 = (long)psVar18;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          plVar12 = (long *)std::__cxx11::string::append((char *)&local_1578);
          uVar28 = local_1598;
          pppfVar17 = (float ***)(plVar12 + 2);
          if ((float ***)*plVar12 == pppfVar17) {
            local_1548.embd = (float *)*pppfVar17;
            local_1548.pos = (llama_pos *)plVar12[3];
            local_1548._0_8_ = &local_1548.embd;
          }
          else {
            local_1548.embd = (float *)*pppfVar17;
            local_1548._0_8_ = (float ***)*plVar12;
          }
          uVar10 = 2 - (uVar27 < 10);
          uVar22 = (uint)local_15a8;
          if (uVar27 < 1000) {
            uVar22 = 3;
          }
          if (uVar27 < 100) {
            uVar22 = uVar10;
          }
          local_1548.token = (llama_token *)plVar12[1];
          *plVar12 = (long)pppfVar17;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          if (uVar27 < 10) {
            uVar22 = uVar10;
          }
          local_14e0 = local_14d0;
          std::__cxx11::string::_M_construct((ulong)&local_14e0,(char)uVar22 + (char)local_1598);
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)((long)local_14e0 + uVar28),uVar22,uVar27);
          ppfVar24 = (float **)0xf;
          if ((float **)local_1548._0_8_ != &local_1548.embd) {
            ppfVar24 = (float **)local_1548.embd;
          }
          if (ppfVar24 < (float **)(local_14d8 + (long)local_1548.token)) {
            ppfVar24 = (float **)0xf;
            if (local_14e0 != local_14d0) {
              ppfVar24 = local_14d0[0];
            }
            if (ppfVar24 < (float **)(local_14d8 + (long)local_1548.token)) goto LAB_001253c7;
            puVar13 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_14e0,0,(char *)0x0,local_1548._0_8_);
          }
          else {
LAB_001253c7:
            puVar13 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_1548,(ulong)local_14e0);
          }
          ppgVar1 = (ggml_backend_dev_t *)(puVar13 + 2);
          if ((ggml_backend_dev_t *)*puVar13 == ppgVar1) {
            local_1428[0] = *ppgVar1;
            local_1428[1] = (ggml_backend_dev_t)puVar13[3];
            local_1438._0_8_ = local_1428;
          }
          else {
            local_1428[0] = *ppgVar1;
            local_1438._0_8_ = (ggml_backend_dev_t *)*puVar13;
          }
          local_1438._8_8_ = puVar13[1];
          *puVar13 = ppgVar1;
          puVar13[1] = 0;
          *(undefined1 *)ppgVar1 = 0;
          plVar12 = (long *)std::__cxx11::string::append(local_1438);
          local_13f0._0_8_ = &local_13f0.n_threads;
          plVar19 = plVar12 + 2;
          if ((long *)*plVar12 == plVar19) {
            local_13f0._16_8_ = *plVar19;
            local_13f0._24_8_ = plVar12[3];
          }
          else {
            local_13f0._16_8_ = *plVar19;
            local_13f0._0_8_ = (long *)*plVar12;
          }
          local_13f0._8_8_ = plVar12[1];
          *plVar12 = (long)plVar19;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          std::__cxx11::string::_M_append((char *)text,local_13f0._0_8_);
          if ((int32_t *)local_13f0._0_8_ != &local_13f0.n_threads) {
            operator_delete((void *)local_13f0._0_8_,local_13f0._16_8_ + 1);
          }
          uVar28 = local_1598;
          if ((ggml_backend_dev_t *)local_1438._0_8_ != local_1428) {
            operator_delete((void *)local_1438._0_8_,(ulong)(local_1428[0] + 1));
          }
          if (local_14e0 != local_14d0) {
            operator_delete(local_14e0,(long)local_14d0[0] + 1);
          }
          if ((float **)local_1548._0_8_ != &local_1548.embd) {
            operator_delete((void *)local_1548._0_8_,(long)local_1548.embd + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1578._M_dataplus._M_p != &local_1578.field_2) {
            operator_delete(local_1578._M_dataplus._M_p,local_1578.field_2._M_allocated_capacity + 1
                           );
          }
          if (local_14b0[0] != local_14a0) {
            operator_delete(local_14b0[0],local_14a0[0] + 1);
          }
        }
        std::__cxx11::string::append((char *)text);
        iVar9 = iVar9 + 1;
      } while (local_159c != iVar9);
    }
    std::__cxx11::string::_M_append((char *)text,(ulong)local_1488[0]);
    llama_backend_init();
    llama_numa_init(local_1378.numa);
    common_model_params_to_llama((llama_model_params *)local_1438,&local_1378);
    puVar13 = (undefined8 *)local_1438;
    piVar25 = local_1638;
    for (lVar20 = 9; lVar20 != 0; lVar20 = lVar20 + -1) {
      *(undefined8 *)piVar25 = *puVar13;
      puVar13 = puVar13 + (ulong)bVar8 * -2 + 1;
      piVar25 = (int *)((long)piVar25 + ((ulong)bVar8 * -2 + 1) * 8);
    }
    lVar20 = llama_model_load_from_file(local_1378.model.path._M_dataplus._M_p);
    if (lVar20 == 0) {
      iVar9 = 1;
      if (-1 < common_log_verbosity_thold) {
        pcVar16 = common_log_main();
        common_log_add(pcVar16,GGML_LOG_LEVEL_ERROR,"%s: unable to load model\n","main");
      }
    }
    else {
      local_1440 = llama_model_get_vocab(lVar20);
      common_context_params_to_llama(&local_13f0,&local_1378);
      iVar9 = llama_model_n_ctx_train(lVar20);
      local_13f0.n_ctx = iVar9 * (int)local_1580 + (int)local_14f8;
      if ((int)((ulong)local_13f0.n_batch % (local_1580 & 0xffffffff)) != 0) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/passkey/passkey.cpp"
                   ,0x52,"GGML_ASSERT(%s) failed",
                   "ctx_params.n_batch % n_grp == 0 && \"n_batch must be divisible by n_grp\"");
      }
      puVar13 = (undefined8 *)&local_13f0;
      piVar25 = local_1638;
      for (lVar21 = 0xf; lVar21 != 0; lVar21 = lVar21 + -1) {
        *(undefined8 *)piVar25 = *puVar13;
        puVar13 = puVar13 + (ulong)bVar8 * -2 + 1;
        piVar25 = (int *)((long)piVar25 + ((ulong)bVar8 * -2 + 1) * 8);
      }
      plVar14 = (llama_context *)llama_init_from_model(lVar20);
      if (plVar14 == (llama_context *)0x0) {
        iVar9 = 1;
        if (-1 < common_log_verbosity_thold) {
          pcVar16 = common_log_main();
          common_log_add(pcVar16,GGML_LOG_LEVEL_ERROR,"%s: failed to create the llama_context\n",
                         "main");
        }
      }
      else {
        uVar7 = llama_sampler_chain_default_params();
        local_14b8 = llama_sampler_chain_init(uVar7);
        uVar15 = llama_sampler_init_greedy();
        llama_sampler_chain_add(local_14b8,uVar15);
        local_1448 = lVar20;
        common_tokenize((vector<int,_std::allocator<int>_> *)&local_1548,plVar14,text,true,false);
        plVar4 = local_1548.token;
        uVar15 = local_1548._0_8_;
        local_14c0 = (float **)local_1548.embd;
        local_1588 = (float ***)local_1548._0_8_;
        common_tokenize((vector<int,_std::allocator<int>_> *)&local_1548,plVar14,&local_1468,true,
                        false);
        plVar5 = local_1548.token;
        uVar3 = local_1548._0_8_;
        if ((float ***)local_1548._0_8_ != (float ***)0x0) {
          operator_delete((void *)local_1548._0_8_,(long)local_1548.embd - local_1548._0_8_);
        }
        local_15b8 = llama_n_ctx(plVar14);
        iVar9 = llama_n_ctx(plVar14);
        uVar28 = (ulong)((long)plVar4 - uVar15) >> 2;
        local_14e4 = (int)uVar28 + 0x10;
        local_15b8 = local_15b8 - (int)local_14f8;
        local_1558 = (ulong)(int)local_13f0.n_batch;
        local_154c = local_13f0.n_batch / (uint)local_1580;
        if (-1 < common_log_verbosity_thold) {
          pcVar16 = common_log_main();
          local_1618 = local_158c;
          iStack_1620 = local_159c;
          local_1628 = (undefined4)local_1558;
          iStack_1630 = (int)local_1580;
          local_1638[0] = iVar9;
          common_log_add(pcVar16,GGML_LOG_LEVEL_INFO,
                         "\n%s: n_len = %d, n_ctx = %d, n_kv_req = %d, n_grp = %d, n_batch = %d, n_junk = %d, i_pos = %d\n"
                         ,"main",(ulong)local_14e4,(ulong)local_15b8);
        }
        if (-1 < common_log_verbosity_thold) {
          pcVar16 = common_log_main();
          common_log_add(pcVar16,GGML_LOG_LEVEL_INFO,"\n");
        }
        if (-1 < common_log_verbosity_thold) {
          pcVar16 = common_log_main();
          common_log_add(pcVar16,GGML_LOG_LEVEL_INFO,"prefix tokens: %d\n",
                         (ulong)((long)plVar5 - uVar3) >> 2 & 0xffffffff);
        }
        if (-1 < common_log_verbosity_thold) {
          pcVar16 = common_log_main();
          common_log_add(pcVar16,GGML_LOG_LEVEL_INFO,"prompt tokens: %d\n",uVar28 & 0xffffffff);
        }
        local_15b0 = plVar14;
        llama_batch_init(&local_1548,local_1378.n_batch,0,1);
        local_15a8 = local_1558 & 0xffffffff;
        local_154c = local_154c * ((int)local_1580 + -1);
        local_1598 = (ulong)(int)uVar28;
        local_1508 = (ulong)(int)local_15b8;
        pppfVar17 = (float ***)(local_1558 * 4);
        local_1500 = (float ***)uVar15;
        iVar9 = 0;
        uVar29 = 0;
        local_14f0 = uVar28;
        local_1490 = pppfVar17;
        while( true ) {
          plVar14 = local_15b0;
          local_15b4 = 0;
          local_15a0 = (undefined4)CONCAT71((int7)((ulong)pppfVar17 >> 8),1);
          if ((long)local_1508 <= (long)uVar29) break;
          if (0 < (long)uVar29 && 1 < (int)(uint)local_1580) {
            iVar26 = ((int)((long)((ulong)(uint)((int)uVar29 >> 0x1f) << 0x20 | uVar29 & 0xffffffff)
                           / (long)(int)(uint)local_15a8) + -1) * local_154c;
            iVar23 = iVar9 - (int)local_1558;
            llama_kv_self_seq_add(local_15b0,0,iVar23,iVar9,iVar26);
            llama_kv_self_seq_div(plVar14,0,iVar23 + iVar26,iVar9 + iVar26);
            llama_kv_self_update(plVar14);
            iVar9 = llama_kv_self_seq_pos_max(plVar14);
            iVar9 = iVar9 + 1;
          }
          common_batch_clear(&local_1548);
          if (0 < (int)local_1558) {
            uVar28 = 0;
            do {
              if ((long)local_1598 <= (long)(uVar28 + uVar29)) break;
              lVar11 = *(llama_token *)((long)local_1500 + uVar28 * 4);
              local_14b0[0] = (long *)((ulong)local_14b0[0] & 0xffffffff00000000);
              __l._M_len = 1;
              __l._M_array = (iterator)local_14b0;
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)&local_1578,__l,
                         (allocator_type *)&local_14e0);
              common_batch_add(&local_1548,lVar11,iVar9 + (int)uVar28,
                               (vector<int,_std::allocator<int>_> *)&local_1578,false);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1578._M_dataplus._M_p !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                operator_delete(local_1578._M_dataplus._M_p,
                                local_1578.field_2._M_allocated_capacity -
                                (long)local_1578._M_dataplus._M_p);
              }
              uVar28 = uVar28 + 1;
            } while (local_15a8 != uVar28);
            iVar9 = iVar9 + (int)uVar28;
          }
          uVar28 = local_1558 + uVar29;
          if ((long)local_1598 <= (long)uVar28) {
            local_1548.logits[(long)local_1548.n_tokens + -1] = '\x01';
          }
          local_1608 = local_1548.logits;
          local_1618 = (int)local_1548.n_seq_id;
          uStack_1614 = local_1548.n_seq_id._4_4_;
          uStack_1610 = local_1548.seq_id._0_4_;
          uStack_160c = local_1548.seq_id._4_4_;
          local_1628 = local_1548.embd._0_4_;
          uStack_1624 = local_1548.embd._4_4_;
          iStack_1620 = (int)local_1548.pos;
          uStack_161c = local_1548.pos._4_4_;
          local_1638[0] = local_1548.n_tokens;
          local_1638[1] = local_1548._4_4_;
          iStack_1630 = (int)local_1548.token;
          uStack_162c = local_1548.token._4_4_;
          iVar23 = llama_decode(local_15b0);
          if (iVar23 != 0) {
            local_15b4 = 1;
            if (common_log_verbosity_thold < 0) {
              local_15a0 = 0;
            }
            else {
              pcVar16 = common_log_main();
              local_15a0 = 0;
              common_log_add(pcVar16,GGML_LOG_LEVEL_INFO,"%s: llama_decode() failed\n","main");
            }
            break;
          }
          if (-1 < common_log_verbosity_thold) {
            pcVar16 = common_log_main();
            uVar2 = local_14f0;
            if ((int)uVar28 < (int)local_14f0) {
              uVar2 = uVar28;
            }
            common_log_add(pcVar16,GGML_LOG_LEVEL_INFO,"%s: processed: [%6d, %6d)\n","main",
                           uVar29 & 0xffffffff,uVar2 & 0xffffffff);
          }
          pppfVar17 = (float ***)((long)local_1500 + (long)local_1490);
          uVar29 = uVar28;
          local_1500 = pppfVar17;
          if ((long)local_1598 <= (long)uVar28) break;
        }
        pppfVar17 = local_1588;
        if ((byte)local_15a0 != '\0') {
          iVar23 = (int)local_14f0;
          bVar8 = (int)local_15b8 < iVar23;
          if ((int)local_15b8 < iVar23) {
            local_1598 = CONCAT44(local_1598._4_4_,(int)local_14f8 + (int)local_1558);
            local_1580 = CONCAT44(local_1580._4_4_,-(int)local_15a8);
            lVar21 = (long)iVar23;
            lVar20 = (long)local_1588 + local_1508 * 4;
            do {
              local_15a0 = CONCAT31(local_15a0._1_3_,bVar8);
              if (-1 < common_log_verbosity_thold) {
                pcVar16 = common_log_main();
                common_log_add(pcVar16,GGML_LOG_LEVEL_INFO,"%s: shifting KV cache with %d\n","main",
                               local_15a8);
              }
              llama_kv_self_seq_rm(local_15b0,0,local_14f8,local_1598 & 0xffffffff);
              llama_kv_self_seq_add(local_15b0,0,local_1598 & 0xffffffff,local_15b8);
              llama_kv_self_update(local_15b0);
              iVar9 = llama_kv_self_seq_pos_max(local_15b0);
              common_batch_clear(&local_1548);
              iVar9 = iVar9 + 1;
              if (0 < (int)(uint)local_15a8) {
                local_1500 = (float ***)CONCAT44(local_1500._4_4_,iVar9);
                uVar28 = 0;
                do {
                  if (lVar21 <= (long)(local_1508 + uVar28)) break;
                  lVar11 = *(llama_token *)(lVar20 + uVar28 * 4);
                  local_14b0[0] = (long *)((ulong)local_14b0[0] & 0xffffffff00000000);
                  __l_00._M_len = 1;
                  __l_00._M_array = (iterator)local_14b0;
                  std::vector<int,_std::allocator<int>_>::vector
                            ((vector<int,_std::allocator<int>_> *)&local_1578,__l_00,
                             (allocator_type *)&local_14e0);
                  common_batch_add(&local_1548,lVar11,iVar9 + (int)uVar28,
                                   (vector<int,_std::allocator<int>_> *)&local_1578,false);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1578._M_dataplus._M_p !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0) {
                    operator_delete(local_1578._M_dataplus._M_p,
                                    local_1578.field_2._M_allocated_capacity -
                                    (long)local_1578._M_dataplus._M_p);
                  }
                  uVar28 = uVar28 + 1;
                } while (local_15a8 != uVar28);
                iVar9 = (int)local_1500 + (int)uVar28;
              }
              uVar28 = local_1508 + local_1558;
              if (lVar21 <= (long)uVar28) {
                local_1548.logits[(long)local_1548.n_tokens + -1] = '\x01';
              }
              local_1608 = local_1548.logits;
              local_1618 = (int)local_1548.n_seq_id;
              uStack_1614 = local_1548.n_seq_id._4_4_;
              uStack_1610 = local_1548.seq_id._0_4_;
              uStack_160c = local_1548.seq_id._4_4_;
              local_1628 = local_1548.embd._0_4_;
              uStack_1624 = local_1548.embd._4_4_;
              iStack_1620 = (int)local_1548.pos;
              uStack_161c = local_1548.pos._4_4_;
              local_1638[0] = local_1548.n_tokens;
              local_1638[1] = local_1548._4_4_;
              iStack_1630 = (int)local_1548.token;
              uStack_162c = local_1548.token._4_4_;
              iVar23 = llama_decode(local_15b0);
              if (iVar23 == 0) {
                if (-1 < common_log_verbosity_thold) {
                  pcVar16 = common_log_main();
                  uVar29 = local_14f0;
                  if ((int)uVar28 < (int)local_14f0) {
                    uVar29 = uVar28;
                  }
                  common_log_add(pcVar16,GGML_LOG_LEVEL_INFO,"%s: processed: [%6d, %6d)\n","main",
                                 local_1508,uVar29 & 0xffffffff);
                }
              }
              else {
                local_15b4 = 1;
                if (-1 < common_log_verbosity_thold) {
                  pcVar16 = common_log_main();
                  common_log_add(pcVar16,GGML_LOG_LEVEL_ERROR,"%s: llama_decode() failed\n","main");
                }
              }
              if (iVar23 != 0) {
                bVar8 = (byte)local_15a0;
                break;
              }
              lVar20 = lVar20 + (long)local_1490;
              bVar8 = (long)uVar28 < lVar21;
              local_1508 = uVar28;
            } while ((long)uVar28 < lVar21);
          }
          pppfVar17 = local_1588;
          plVar14 = local_15b0;
          if ((bVar8 & 1) == 0) {
            iVar23 = iVar9 - local_15b8;
            if (-0x10 < iVar23) {
              if (-1 < common_log_verbosity_thold) {
                pcVar16 = common_log_main();
                common_log_add(pcVar16,GGML_LOG_LEVEL_INFO,
                               "%s: shifting KV cache with %d to free space for the answer\n","main"
                               ,(ulong)(iVar23 + 0x10U));
              }
              iVar9 = iVar23 + 0x10U + (int)local_14f8;
              llama_kv_self_seq_rm(plVar14,0,local_14f8,iVar9);
              llama_kv_self_seq_add(plVar14,0,iVar9,local_15b8,-0x10 - iVar23);
              llama_kv_self_update(plVar14);
              iVar9 = llama_kv_self_seq_pos_max(plVar14);
              iVar9 = iVar9 + 1;
            }
            if (-1 < common_log_verbosity_thold) {
              pcVar16 = common_log_main();
              common_log_add(pcVar16,GGML_LOG_LEVEL_INFO,"\n");
            }
            if (-1 < common_log_verbosity_thold) {
              pcVar16 = common_log_main();
              iStack_1630 = (local_158c * (int)local_14f0) / local_159c;
              local_1638[0] = local_159c;
              common_log_add(pcVar16,GGML_LOG_LEVEL_INFO,
                             "%s: passkey = %d, inserted at position %d / %d (token pos: ~%d)\n",
                             "main",(ulong)local_14e8);
            }
            if (-1 < common_log_verbosity_thold) {
              pcVar16 = common_log_main();
              common_log_add(pcVar16,GGML_LOG_LEVEL_INFO,"\n");
            }
            if (-1 < common_log_verbosity_thold) {
              pcVar16 = common_log_main();
              common_log_add(pcVar16,GGML_LOG_LEVEL_INFO,"%s",local_1488[0]);
            }
            local_15a8 = ggml_time_us();
            iVar23 = 0;
            uVar27 = 0;
            do {
              if ((int)local_14e4 < (int)local_14f0 + iVar23) {
LAB_001262e5:
                if (-1 < common_log_verbosity_thold) {
                  pcVar16 = common_log_main();
                  common_log_add(pcVar16,GGML_LOG_LEVEL_NONE,"\n");
                }
                lVar20 = ggml_time_us();
                if (-1 < common_log_verbosity_thold) {
                  pcVar16 = common_log_main();
                  fVar30 = (float)(long)(lVar20 - local_15a8) / 1e+06;
                  common_log_add(pcVar16,GGML_LOG_LEVEL_INFO,
                                 "%s: decoded %d tokens in %.2f s, speed: %.2f t/s\n",
                                 SUB84((double)fVar30,0),
                                 SUB84((double)((float)(int)uVar27 / fVar30),0),"main",(ulong)uVar27
                                );
                }
                if (-1 < common_log_verbosity_thold) {
                  pcVar16 = common_log_main();
                  common_log_add(pcVar16,GGML_LOG_LEVEL_NONE,"\n");
                }
                llama_perf_context_print(plVar14);
                if (-1 < common_log_verbosity_thold) {
                  pcVar16 = common_log_main();
                  common_log_add(pcVar16,GGML_LOG_LEVEL_NONE,"\n");
                }
                llama_sampler_free(local_14b8);
                local_1608 = local_1548.logits;
                local_1618 = (int)local_1548.n_seq_id;
                uStack_1614 = local_1548.n_seq_id._4_4_;
                uStack_1610 = local_1548.seq_id._0_4_;
                uStack_160c = local_1548.seq_id._4_4_;
                local_1628 = local_1548.embd._0_4_;
                uStack_1624 = local_1548.embd._4_4_;
                iStack_1620 = (int)local_1548.pos;
                uStack_161c = local_1548.pos._4_4_;
                local_1638[0] = local_1548.n_tokens;
                local_1638[1] = local_1548._4_4_;
                iStack_1630 = (int)local_1548.token;
                uStack_162c = local_1548.token._4_4_;
                llama_batch_free();
                llama_free(plVar14);
                llama_model_free(local_1448);
                local_15b4 = 0;
                llama_backend_free();
                goto LAB_0012642e;
              }
              lVar11 = llama_sampler_sample(local_14b8,plVar14,local_1548.n_tokens + -1);
              bVar8 = llama_vocab_is_eog(local_1440);
              bVar8 = bVar8 | iVar23 == 0x10;
              if (bVar8 == 1) {
                if (-1 < common_log_verbosity_thold) {
                  pcVar16 = common_log_main();
                  common_log_add(pcVar16,GGML_LOG_LEVEL_NONE,"\n");
                }
              }
              else {
                if (-1 < common_log_verbosity_thold) {
                  pcVar16 = common_log_main();
                  common_token_to_piece_abi_cxx11_(&local_1578,local_15b0,lVar11,true);
                  common_log_add(pcVar16,GGML_LOG_LEVEL_NONE,"%s",local_1578._M_dataplus._M_p);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1578._M_dataplus._M_p != &local_1578.field_2) {
                    operator_delete(local_1578._M_dataplus._M_p,
                                    local_1578.field_2._M_allocated_capacity + 1);
                  }
                }
                common_batch_clear(&local_1548);
                local_14b0[0] = (long *)((ulong)local_14b0[0] & 0xffffffff00000000);
                __l_01._M_len = 1;
                __l_01._M_array = (iterator)local_14b0;
                std::vector<int,_std::allocator<int>_>::vector
                          ((vector<int,_std::allocator<int>_> *)&local_1578,__l_01,
                           (allocator_type *)&local_14e0);
                common_batch_add(&local_1548,lVar11,iVar9,
                                 (vector<int,_std::allocator<int>_> *)&local_1578,true);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1578._M_dataplus._M_p !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  operator_delete(local_1578._M_dataplus._M_p,
                                  local_1578.field_2._M_allocated_capacity -
                                  (long)local_1578._M_dataplus._M_p);
                }
                uVar27 = uVar27 + 1;
                iVar9 = iVar9 + 1;
              }
              pppfVar17 = local_1588;
              plVar14 = local_15b0;
              if (bVar8 != 0) goto LAB_001262e5;
              local_1608 = local_1548.logits;
              local_1618 = (int)local_1548.n_seq_id;
              uStack_1614 = local_1548.n_seq_id._4_4_;
              uStack_1610 = local_1548.seq_id._0_4_;
              uStack_160c = local_1548.seq_id._4_4_;
              local_1628 = local_1548.embd._0_4_;
              uStack_1624 = local_1548.embd._4_4_;
              iStack_1620 = (int)local_1548.pos;
              uStack_161c = local_1548.pos._4_4_;
              local_1638[0] = local_1548.n_tokens;
              local_1638[1] = local_1548._4_4_;
              iStack_1630 = (int)local_1548.token;
              uStack_162c = local_1548.token._4_4_;
              iVar26 = llama_decode(local_15b0);
              iVar23 = iVar23 + 1;
            } while (iVar26 == 0);
            if (common_log_verbosity_thold < 0) {
              local_15b4 = 1;
            }
            else {
              pcVar16 = common_log_main();
              local_15b4 = 1;
              common_log_add(pcVar16,GGML_LOG_LEVEL_ERROR,"%s : failed to eval, return code %d\n",
                             "main",1);
            }
          }
        }
LAB_0012642e:
        iVar9 = local_15b4;
        if (pppfVar17 != (float ***)0x0) {
          operator_delete(pppfVar17,(long)local_14c0 - (long)pppfVar17);
          iVar9 = local_15b4;
        }
      }
    }
    if (local_1488[0] != local_1478) {
      operator_delete(local_1488[0],local_1478[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1468._M_dataplus._M_p != &local_1468.field_2) {
      operator_delete(local_1468._M_dataplus._M_p,local_1468.field_2._M_allocated_capacity + 1);
    }
  }
  common_params::~common_params(&local_1378);
  return iVar9;
}

Assistant:

int main(int argc, char ** argv) {
    common_params params;

    params.n_junk = 250;
    params.n_keep = 32;
    params.i_pos  = -1;

    if (!common_params_parse(argc, argv, params, LLAMA_EXAMPLE_PASSKEY, print_usage)) {
        return 1;
    }

    common_init();

    int n_junk = params.n_junk;
    int n_keep = params.n_keep;
    int n_grp  = params.grp_attn_n;
    int i_pos  = params.i_pos;

    if (i_pos == -1) {
        i_pos = rand() % n_junk;
    }

    const std::string prompt_prefix = "There is an important info hidden inside a lot of irrelevant text. Find it and memorize them. I will quiz you about the important information there.";
    const std::string prompt_suffix = " What is the pass key? The pass key is";

    // generate junk text
    params.prompt = prompt_prefix;

    const int passkey = rand() % 50000 + 1;

    for (int i = 0; i < n_junk; i++) {
        if (i % n_junk == i_pos) {
            params.prompt += " The pass key is " + std::to_string(passkey) + ". Remember it. " + std::to_string(passkey) + " is the pass key.";
        }

        params.prompt += " The grass is green. The sky is blue. The sun is yellow. Here we go. There and back again.";
    }

    params.prompt += prompt_suffix;

    // init LLM

    llama_backend_init();
    llama_numa_init(params.numa);

    // initialize the model

    llama_model_params model_params = common_model_params_to_llama(params);

    llama_model * model = llama_model_load_from_file(params.model.path.c_str(), model_params);

    if (model == NULL) {
        LOG_ERR("%s: unable to load model\n" , __func__);
        return 1;
    }

    const llama_vocab * vocab = llama_model_get_vocab(model);

    // initialize the context

    llama_context_params ctx_params = common_context_params_to_llama(params);

    ctx_params.n_ctx = llama_model_n_ctx_train(model)*n_grp + n_keep;

    GGML_ASSERT(ctx_params.n_batch % n_grp == 0 && "n_batch must be divisible by n_grp");

    llama_context * ctx = llama_init_from_model(model, ctx_params);
    if (ctx == NULL) {
        LOG_ERR("%s: failed to create the llama_context\n" , __func__);
        return 1;
    }

    auto sparams = llama_sampler_chain_default_params();

    llama_sampler * smpl = llama_sampler_chain_init(sparams);

    llama_sampler_chain_add(smpl, llama_sampler_init_greedy());

    // tokenize the prompt
    std::vector<llama_token> tokens_list;
    tokens_list = common_tokenize(ctx, params.prompt, true);

    // tokenize the prefix and use it as a sink
    const int n_tokens_prefix = common_tokenize(ctx, prompt_prefix, true).size();

    const int n_tokens_all = tokens_list.size();

    // we leave a margin of 16 tokens for the generated text - it should contain just the passkey
    const int n_predict = 16;

    // total length of the sequences including the prompt
    const int n_len = n_tokens_all + n_predict;

    const int n_ctx       = llama_n_ctx(ctx) - n_keep;
    const int n_kv_req    = llama_n_ctx(ctx);
    const int n_batch     = ctx_params.n_batch;
    const int n_batch_grp = ctx_params.n_batch/n_grp;

    LOG_INF("\n%s: n_len = %d, n_ctx = %d, n_kv_req = %d, n_grp = %d, n_batch = %d, n_junk = %d, i_pos = %d\n", __func__, n_len, n_ctx, n_kv_req, n_grp, n_batch, n_junk, i_pos);

    // print the prompt token-by-token

    LOG_INF("\n");
    LOG_INF("prefix tokens: %d\n", n_tokens_prefix);
    LOG_INF("prompt tokens: %d\n", n_tokens_all);
    //LOG_INF("prompt: %s\n", params.prompt.c_str());

    llama_batch batch = llama_batch_init(params.n_batch, 0, 1);

    int n_past = 0;

    // fill the KV cache
    for (int i = 0; i < n_ctx; i += n_batch) {
        if (i > 0 && n_grp > 1) {
            // if SelfExtend is enabled, we compress the position from the last batch by a factor of n_grp
            const int ib = i/n_batch - 1;
            const int bd = n_batch_grp*(n_grp - 1);

            llama_kv_self_seq_add (ctx, 0, n_past - n_batch,         n_past,         ib*bd);
            llama_kv_self_seq_div (ctx, 0, n_past - n_batch + ib*bd, n_past + ib*bd, n_grp);
            llama_kv_self_update  (ctx);

            n_past = llama_kv_self_seq_pos_max(ctx, 0) + 1;
        }

        common_batch_clear(batch);

        for (int j = 0; j < n_batch && i + j < n_tokens_all; j++) {
            common_batch_add(batch, tokens_list[i + j], n_past++, { 0 }, false);
        }

        if (i + n_batch >= n_tokens_all) {
            batch.logits[batch.n_tokens - 1] = true;
        }

        if (llama_decode(ctx, batch) != 0) {
            LOG_INF("%s: llama_decode() failed\n", __func__);
            return 1;
        }

        LOG_INF("%s: processed: [%6d, %6d)\n", __func__, i, std::min(i + n_batch, n_tokens_all));

        if (i + n_batch >= n_tokens_all) {
            break;
        }
    }

    for (int i = n_ctx; i < n_tokens_all; i += n_batch) {
        const int n_discard = n_batch;

        LOG_INF("%s: shifting KV cache with %d\n", __func__, n_discard);

        llama_kv_self_seq_rm (ctx, 0, n_keep            , n_keep + n_discard);
        llama_kv_self_seq_add(ctx, 0, n_keep + n_discard, n_ctx,  -n_discard);
      //llama_kv_self_defrag (ctx);
        llama_kv_self_update (ctx);

        n_past = llama_kv_self_seq_pos_max(ctx, 0) + 1;

        common_batch_clear(batch);

        for (int j = 0; j < n_batch && i + j < n_tokens_all; j++) {
            common_batch_add(batch, tokens_list[i + j], n_past++, { 0 }, false);
        }

        if (i + n_batch >= n_tokens_all) {
            batch.logits[batch.n_tokens - 1] = true;
        }

        if (llama_decode(ctx, batch) != 0) {
            LOG_ERR("%s: llama_decode() failed\n", __func__);
            return 1;
        }

        LOG_INF("%s: processed: [%6d, %6d)\n", __func__, i, std::min(i + n_batch, n_tokens_all));
    }

    {
        const int n_discard = n_past - n_ctx + n_predict;

        if (n_discard > 0) {
            LOG_INF("%s: shifting KV cache with %d to free space for the answer\n", __func__, n_discard);

            llama_kv_self_seq_rm (ctx, 0, n_keep            , n_keep + n_discard);
            llama_kv_self_seq_add(ctx, 0, n_keep + n_discard, n_ctx,  -n_discard);
          //llama_kv_self_defrag (ctx);
            llama_kv_self_update (ctx);

            n_past = llama_kv_self_seq_pos_max(ctx, 0) + 1;
        }
    }

    LOG_INF("\n");
    LOG_INF("%s: passkey = %d, inserted at position %d / %d (token pos: ~%d)\n", __func__, passkey, i_pos, n_junk, (i_pos * n_tokens_all) / n_junk);
    LOG_INF("\n");

    // main loop

    int n_cur    = n_tokens_all;
    int n_decode = 0;

    LOG_INF("%s", prompt_suffix.c_str());

    const auto t_main_start = ggml_time_us();

    while (n_cur <= n_len) {
        // sample the next token
        {
            const llama_token new_token_id = llama_sampler_sample(smpl, ctx, batch.n_tokens - 1);

            // is it an end of generation?
            if (llama_vocab_is_eog(vocab, new_token_id) || n_cur == n_len) {
                LOG("\n");

                break;
            }

            LOG("%s", common_token_to_piece(ctx, new_token_id).c_str());

            n_decode += 1;

            // prepare the next batch
            common_batch_clear(batch);

            // push this new token for next evaluation
            common_batch_add(batch, new_token_id, n_past++, { 0 }, true);
        }

        n_cur += 1;

        // evaluate the current batch with the transformer model
        if (llama_decode(ctx, batch)) {
            LOG_ERR("%s : failed to eval, return code %d\n", __func__, 1);
            return 1;
        }
    }

    LOG("\n");

    const auto t_main_end = ggml_time_us();

    LOG_INF("%s: decoded %d tokens in %.2f s, speed: %.2f t/s\n",
            __func__, n_decode, (t_main_end - t_main_start) / 1000000.0f, n_decode / ((t_main_end - t_main_start) / 1000000.0f));

    LOG("\n");
    llama_perf_context_print(ctx);

    LOG("\n");

    llama_sampler_free(smpl);

    llama_batch_free(batch);

    llama_free(ctx);
    llama_model_free(model);

    llama_backend_free();

    return 0;
}